

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O3

bool SerializeContextState(SSL_CTX *ctx,CBB *cbb)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *__range1;
  ssl_session_st **sess;
  undefined8 *puVar4;
  vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> sessions;
  CBB out;
  uint8_t keys [48];
  CBB ticket_keys;
  CBB ctx_sessions;
  undefined8 *local_118;
  undefined8 *puStack_110;
  long local_108;
  CBB local_f8;
  code *local_c8;
  undefined1 *local_c0;
  uint8_t local_b8 [48];
  CBB local_88;
  CBB local_58;
  
  iVar3 = CBB_add_u24_length_prefixed(cbb,&local_f8);
  if (iVar3 != 0) {
    iVar3 = CBB_add_u16(&local_f8,0);
    if (iVar3 == 0) {
      return false;
    }
    iVar3 = SSL_CTX_get_tlsext_ticket_keys(ctx,local_b8,0x30);
    if ((((iVar3 != 0) && (iVar3 = CBB_add_u8_length_prefixed(&local_f8,&local_88), iVar3 != 0)) &&
        (iVar3 = CBB_add_bytes(&local_88,local_b8,0x30), iVar3 != 0)) &&
       (iVar3 = CBB_add_asn1(&local_f8,&local_58,0x20000010), iVar3 != 0)) {
      local_118 = (undefined8 *)0x0;
      puStack_110 = (undefined8 *)0x0;
      local_108 = 0;
      local_c8 = push_session;
      local_c0 = (undefined1 *)&local_118;
      OPENSSL_lh_doall_arg((_LHASH *)ctx->sessions,lh_SSL_SESSION_call_doall_arg,&local_c8);
      puVar1 = puStack_110;
      if (local_118 != puStack_110) {
        puVar4 = local_118;
        do {
          bVar2 = bssl::ssl_session_serialize((SSL_SESSION *)*puVar4,&local_58);
          if (!bVar2) {
            bVar2 = false;
            goto LAB_001330b2;
          }
          puVar4 = puVar4 + 1;
        } while (puVar4 != puVar1);
      }
      iVar3 = CBB_flush(cbb);
      bVar2 = iVar3 != 0;
LAB_001330b2:
      if (local_118 == (undefined8 *)0x0) {
        return bVar2;
      }
      operator_delete(local_118,local_108 - (long)local_118);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool SerializeContextState(SSL_CTX *ctx, CBB *cbb) {
  CBB out, ctx_sessions, ticket_keys;
  uint8_t keys[48];
  if (!CBB_add_u24_length_prefixed(cbb, &out) ||
      !CBB_add_u16(&out, 0 /* version */) ||
      !SSL_CTX_get_tlsext_ticket_keys(ctx, &keys, sizeof(keys)) ||
      !CBB_add_u8_length_prefixed(&out, &ticket_keys) ||
      !CBB_add_bytes(&ticket_keys, keys, sizeof(keys)) ||
      !CBB_add_asn1(&out, &ctx_sessions, CBS_ASN1_SEQUENCE)) {
    return false;
  }
  std::vector<SSL_SESSION *> sessions;
  lh_SSL_SESSION_doall_arg(ctx->sessions, push_session, &sessions);
  for (const auto &sess : sessions) {
    if (!ssl_session_serialize(sess, &ctx_sessions)) {
      return false;
    }
  }
  return CBB_flush(cbb);
}